

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biptlist.cpp
# Opt level: O3

EDist __thiscall BiPtList::xHeightToEnds(BiPtList *this,Pt2i *pt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *in_RDX;
  int iVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  Pt2i PVar13;
  int iVar14;
  
  iVar1 = *in_RDX;
  PVar13 = pt[6];
  iVar2 = *(int *)pt[2];
  if (PVar13 == pt[7]) {
    piVar10 = (int *)(*(long *)((long)pt[9] + -8) + 0x1f8);
    PVar13 = (Pt2i)(*(long *)((long)pt[9] + -8) + 0x200);
  }
  else {
    piVar10 = (int *)((long)PVar13 + -8);
  }
  iVar3 = in_RDX[1];
  iVar4 = *(int *)((long)pt[2] + 4);
  iVar5 = *piVar10;
  iVar6 = *(int *)((long)PVar13 + -4);
  iVar14 = iVar3;
  iVar12 = iVar1;
  if (iVar1 < iVar2) {
    iVar8 = iVar2;
    iVar7 = iVar4;
    iVar11 = iVar5;
    iVar9 = iVar6;
    if (iVar1 < iVar5) {
      iVar14 = iVar6;
      iVar12 = iVar5;
      if (iVar2 < iVar5) {
        iVar14 = iVar4;
        iVar12 = iVar2;
      }
      iVar8 = iVar5;
      if (iVar5 < iVar2) {
        iVar8 = iVar2;
      }
      iVar11 = iVar1;
      iVar9 = iVar3;
      if (iVar2 < iVar5) {
        iVar7 = iVar6;
      }
    }
  }
  else {
    iVar8 = iVar5;
    iVar7 = iVar6;
    iVar11 = iVar2;
    iVar9 = iVar4;
    if (iVar5 <= iVar1) {
      iVar9 = iVar6;
      iVar11 = iVar5;
      if (iVar2 < iVar5) {
        iVar9 = iVar4;
        iVar11 = iVar2;
      }
      iVar12 = iVar5;
      if (iVar5 < iVar2) {
        iVar12 = iVar2;
      }
      iVar8 = iVar1;
      iVar7 = iVar3;
      iVar14 = iVar4;
      if (iVar2 < iVar5) {
        iVar14 = iVar6;
      }
    }
  }
  EDist::EDist((EDist *)this,
               (iVar9 - iVar14) * (iVar8 - iVar11) + (iVar7 - iVar9) * (iVar12 - iVar11),
               iVar8 - iVar11);
  return (EDist)this;
}

Assistant:

EDist BiPtList::xHeightToEnds (const Pt2i &pt) const
{
  int xp = pt.x (), yp = pt.y ();
  int p1x = pts.front().x (), p1y = pts.front().y ();
  int p2x = pts.back().x (), p2y = pts.back().y ();
  int ax, ay, bx, by, cx, cy;

  if (xp < p1x)
  {
    if (xp < p2x)
    {
      ax = xp;
      ay = yp;
      if (p1x < p2x)
      {
        bx = p1x;
        by = p1y;
        cx = p2x;
        cy = p2y;
      }
      else
      {
        bx = p2x;
        by = p2y;
        cx = p1x;
        cy = p1y;
      }
    }
    else
    {
      ax = p2x;
      ay = p2y;
      bx = xp;
      by = yp;
      cx = p1x;
      cy = p1y;
    }
  }
  else
  { 
    if (xp < p2x) 
    { 
      ax = p1x; 
      ay = p1y; 
      bx = xp; 
      by = yp; 
      cx = p2x; 
      cy = p2y; 
    } 
    else
    { 
      cx = xp; 
      cy = yp; 
      if (p1x < p2x) 
      { 
        ax = p1x; 
        ay = p1y; 
        bx = p2x; 
        by = p2y; 
      } 
      else 
      { 
        ax = p2x; 
        ay = p2y; 
        bx = p1x; 
        by = p1y; 
      } 
    } 
  } 
  return (EDist ((bx - ax) * (cy - ay) - (by - ay) * (cx - ax), cx - ax));
}